

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *config,string *gnuName,string *out,char *newExt)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *__s;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_t local_40;
  char *local_38;
  
  bVar3 = HasImplibGNUtoMS(this,config);
  if ((bVar3) && (6 < gnuName->_M_string_length)) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)gnuName);
    iVar4 = std::__cxx11::string::compare((char *)local_70);
    bVar6 = iVar4 == 0;
    bVar3 = true;
  }
  else {
    bVar3 = false;
    bVar6 = false;
  }
  if ((bVar3) && (local_70[0] != local_60)) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (bVar6 != false) {
    pcVar1 = (gnuName->_M_dataplus)._M_p;
    uVar2 = gnuName->_M_string_length;
    uVar5 = uVar2 - 6;
    if (uVar2 < uVar2 - 6) {
      uVar5 = uVar2;
    }
    __s = ".lib";
    if (newExt != (char *)0x0) {
      __s = newExt;
    }
    local_40 = strlen(__s);
    views._M_len = 2;
    views._M_array = &local_50;
    local_50._M_len = uVar5;
    local_50._M_str = pcVar1;
    local_38 = __s;
    cmCatViews_abi_cxx11_(&local_90,views);
    std::__cxx11::string::operator=((string *)out,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar6;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& config,
                                         std::string const& gnuName,
                                         std::string& out,
                                         const char* newExt) const
{
  if (this->HasImplibGNUtoMS(config) && gnuName.size() > 6 &&
      gnuName.substr(gnuName.size() - 6) == ".dll.a") {
    out = cmStrCat(cm::string_view(gnuName).substr(0, gnuName.size() - 6),
                   newExt ? newExt : ".lib");
    return true;
  }
  return false;
}